

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void wasm_instance_exports(wasm_instance_t *instance,wasm_extern_vec_t *out)

{
  FILE *__stream;
  ulong uVar1;
  RefVec *vec;
  Instance *this;
  size_type sVar2;
  wasm_extern_t *this_00;
  Store *this_01;
  const_reference pvVar3;
  RefPtr<wabt::interp::Extern> local_40;
  ulong local_28;
  size_t i;
  RefVec *exports;
  wasm_extern_vec_t *out_local;
  wasm_instance_t *instance_local;
  
  exports = (RefVec *)out;
  out_local = (wasm_extern_vec_t *)instance;
  this = wasm_ref_t::As<wabt::interp::Instance>(&instance->super_wasm_ref_t);
  i = (size_t)wabt::interp::Instance::exports(this);
  vec = exports;
  sVar2 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::size
                    ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)i);
  wasm_extern_vec_new_uninitialized((wasm_extern_vec_t *)vec,sVar2);
  __stream = _stderr;
  sVar2 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::size
                    ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)i);
  fprintf(__stream,"CAPI: [%s] %zx\n","wasm_instance_exports",sVar2);
  local_28 = 0;
  while( true ) {
    uVar1 = local_28;
    sVar2 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::size
                      ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)i);
    if (sVar2 <= uVar1) break;
    this_00 = (wasm_extern_t *)operator_new(0x18);
    this_01 = wabt::interp::RefPtr<wabt::interp::Object>::store
                        ((RefPtr<wabt::interp::Object> *)out_local);
    pvVar3 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                       ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)i,local_28)
    ;
    wabt::interp::Store::UnsafeGet<wabt::interp::Extern>(&local_40,this_01,(Ref)pvVar3->index);
    wasm_extern_t::wasm_extern_t(this_00,&local_40);
    (exports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>)._M_impl.
    super__Vector_impl_data._M_finish[local_28].index = (size_t)this_00;
    wabt::interp::RefPtr<wabt::interp::Extern>::~RefPtr(&local_40);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void wasm_instance_exports(const wasm_instance_t* instance,
                           own wasm_extern_vec_t* out) {
  auto&& exports = instance->As<Instance>()->exports();
  wasm_extern_vec_new_uninitialized(out, exports.size());
  TRACE("%" PRIzx, exports.size());

  for (size_t i = 0; i < exports.size(); ++i) {
    out->data[i] =
        new wasm_extern_t{instance->I.store()->UnsafeGet<Extern>(exports[i])};
  }
}